

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

Ref<anurbs::NurbsCurveGeometry<3L>_> __thiscall
pybind11::detail::
argument_loader<anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
::
call_impl<anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>(*&)(anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
           *this,tuple<pybind11::detail::type_caster<anurbs::Model,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>,_void>_>
                 *f,void_type *param_3,undefined8 param_4)

{
  code *pcVar1;
  __tuple_element_t<0UL,_tuple<type_caster<Model,_void>,_type_caster<basic_string<char>,_void>,_type_caster<shared_ptr<NurbsCurveGeometry<3L>_>,_void>_>_>
  *caster;
  template_cast_op_type<typename_std::add_rvalue_reference<Model_&>::type> pMVar2;
  __tuple_element_t<1UL,_tuple<type_caster<Model,_void>,_type_caster<basic_string<char>,_void>,_type_caster<shared_ptr<NurbsCurveGeometry<3L>_>,_void>_>_>
  *caster_00;
  template_cast_op_type<typename_std::add_rvalue_reference<const_basic_string<char>_&>::type> pbVar3
  ;
  __tuple_element_t<2UL,_tuple<type_caster<Model,_void>,_type_caster<basic_string<char>,_void>,_type_caster<shared_ptr<NurbsCurveGeometry<3L>_>,_void>_>_>
  *caster_01;
  template_cast_op_type<typename_std::add_rvalue_reference<shared_ptr<NurbsCurveGeometry<3L>_>_>::type>
  psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::NurbsCurveGeometry<3L>_> RVar5;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> local_40;
  undefined8 local_30;
  void_type *param_3_local;
  _func_Ref<anurbs::NurbsCurveGeometry<3L>_>_Model_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_shared_ptr<anurbs::NurbsCurveGeometry<3L>_>
  **f_local;
  argument_loader<anurbs::Model_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  *this_local;
  argument_loader<anurbs::Model&,std::__cxx11::string_const&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
  *local_10;
  
  pcVar1 = *(code **)param_3;
  local_30 = param_4;
  param_3_local = param_3;
  f_local = (_func_Ref<anurbs::NurbsCurveGeometry<3L>_>_Model_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_shared_ptr<anurbs::NurbsCurveGeometry<3L>_>
             **)f;
  local_10 = this;
  caster = std::
           get<0ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>,void>>
                     (f);
  pMVar2 = cast_op<anurbs::Model&>(caster);
  caster_00 = std::
              get<1ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>,void>>
                        (f);
  pbVar3 = cast_op<std::__cxx11::string_const&>(caster_00);
  caster_01 = std::
              get<2ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>,void>>
                        (f);
  psVar4 = cast_op<std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>(caster_01);
  std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>::shared_ptr(&local_40,psVar4);
  (*pcVar1)(this,pMVar2,pbVar3,&local_40);
  std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>::~shared_ptr(&local_40);
  RVar5.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar5.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::NurbsCurveGeometry<3L>_>)
         RVar5.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }